

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cc
# Opt level: O0

void rcg::anon_unknown_4::convertBayerGB
               (uint8_t *rgb_out,uint8_t *mono_out,uint8_t *row0,uint8_t *row1,uint8_t *row2,
               bool greenfirst,size_t width)

{
  byte bVar1;
  byte in_R9B;
  size_t i;
  uint8_t blue;
  uint8_t green;
  undefined7 in_stack_00000008;
  uint8_t red;
  uint8_t **mono_out_00;
  undefined7 in_stack_ffffffffffffffd0;
  uint8_t *local_28;
  uint8_t *local_20;
  uint8_t *local_18 [3];
  
  bVar1 = in_R9B & 1;
  mono_out_00 = (uint8_t **)0x0;
  if (bVar1 != 0) {
    convertGreenGB(&stack0xffffffffffffffd6,&stack0xffffffffffffffd5,&stack0xffffffffffffffd4,
                   local_18,&local_20,&local_28);
    storeRGBMono((uint8_t **)CONCAT17(bVar1,in_stack_ffffffffffffffd0),mono_out_00,'\0','\0','\0');
    mono_out_00 = (uint8_t **)((long)mono_out_00 + 1);
  }
  for (; (long)mono_out_00 + 1U < CONCAT17(greenfirst,in_stack_00000008);
      mono_out_00 = (uint8_t **)((long)mono_out_00 + 2)) {
    convertBlue(&stack0xffffffffffffffd6,&stack0xffffffffffffffd5,&stack0xffffffffffffffd4,local_18,
                &local_20,&local_28);
    storeRGBMono((uint8_t **)CONCAT17(bVar1,in_stack_ffffffffffffffd0),mono_out_00,'\0','\0','\0');
    convertGreenGB(&stack0xffffffffffffffd6,&stack0xffffffffffffffd5,&stack0xffffffffffffffd4,
                   local_18,&local_20,&local_28);
    storeRGBMono((uint8_t **)CONCAT17(bVar1,in_stack_ffffffffffffffd0),mono_out_00,'\0','\0','\0');
  }
  if (mono_out_00 < (uint8_t **)CONCAT17(greenfirst,in_stack_00000008)) {
    convertBlue(&stack0xffffffffffffffd6,&stack0xffffffffffffffd5,&stack0xffffffffffffffd4,local_18,
                &local_20,&local_28);
    storeRGBMono((uint8_t **)CONCAT17(bVar1,in_stack_ffffffffffffffd0),mono_out_00,'\0','\0','\0');
  }
  return;
}

Assistant:

void convertBayerGB(uint8_t *rgb_out, uint8_t *mono_out,
  const uint8_t *row0, const uint8_t *row1, const uint8_t *row2,
  bool greenfirst, size_t width)
{
  uint8_t red, green, blue;

  // convert if first pixel is green

  size_t i=0;

  if (greenfirst)
  {
    convertGreenGB(red, green, blue, row0, row1, row2);
    storeRGBMono(rgb_out, mono_out, red, green, blue);

    i++;
  }

  while (i+1 < width)
  {
    // convert at red pixel

    convertBlue(red, green, blue, row0, row1, row2);
    storeRGBMono(rgb_out, mono_out, red, green, blue);

    // convert at green pixel

    convertGreenGB(red, green, blue, row0, row1, row2);
    storeRGBMono(rgb_out, mono_out, red, green, blue);

    i+=2;
  }

  // convert at red pixel

  if (i < width)
  {
    convertBlue(red, green, blue, row0, row1, row2);
    storeRGBMono(rgb_out, mono_out, red, green, blue);
  }
}